

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

int __thiscall deqp::gls::LongStressCase::init(LongStressCase *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  ostringstream *this_00;
  pointer pPVar3;
  long lVar4;
  iterator __position;
  TestLog *this_01;
  RenderContext *renderCtx;
  uint uVar5;
  int iVar6;
  int extraout_EAX;
  pointer pPVar7;
  ulong uVar8;
  TextureLevel *pTVar9;
  SharedPtrStateBase *pSVar10;
  deInt32 *pdVar11;
  pointer pPVar12;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *pGVar13;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *pGVar14;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *pGVar15;
  char *pcVar16;
  size_t sVar17;
  TestLog *pTVar18;
  TextureFormat this_02;
  DebugInfoRenderer *this_03;
  TestError *this_04;
  pointer pPVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  int precision;
  int precision_00;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  last;
  long lVar21;
  int iVar22;
  long lVar23;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  first;
  long lVar24;
  long lVar25;
  long *plVar26;
  byte bVar27;
  long lVar28;
  SharedPtr<tcu::TextureLevel> dummyTex;
  ProgramSources sources;
  TextureFormat format;
  string local_2840;
  string local_2820;
  long *local_2800;
  long local_27f8;
  long local_27f0 [2];
  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  *local_27e0;
  long local_27d8;
  vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_> *local_27d0;
  string local_27c8;
  string local_27a8;
  string local_2788;
  string local_2768;
  string local_2748;
  string local_2728;
  string local_2708;
  string local_26e8;
  string local_26c8;
  string local_26a8;
  string local_2688;
  string local_2668;
  string local_2648;
  string local_2628;
  string local_2608;
  string local_25e8;
  string local_25c8;
  undefined1 local_25a8 [8];
  SharedPtrStateBase *pSStack_25a0;
  ios_base local_2530 [72];
  bool local_24e8;
  undefined1 local_2428 [16];
  undefined1 local_2418 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2410 [3];
  ios_base local_23b8 [8];
  ios_base local_23b0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2398;
  undefined1 local_2378 [208];
  undefined1 local_22a8 [8];
  undefined1 local_22a0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2298 [6];
  ios_base local_2230 [264];
  undefined1 local_2128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2118;
  _Alloc_hider local_2108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20f8 [4];
  ios_base local_20b0 [264];
  undefined1 local_1fa8 [8];
  _func_int **local_1fa0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f98 [6];
  ios_base local_1f30 [264];
  undefined1 local_1e28 [8];
  undefined1 local_1e20 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e18 [6];
  ios_base local_1db0 [264];
  LogSection local_1ca8;
  ios_base local_1c38 [264];
  undefined1 local_1b30 [8];
  undefined1 local_1b28 [8];
  TestLog local_1b20 [13];
  ios_base local_1ab8 [264];
  undefined1 local_19b0 [8];
  undefined1 local_19a8 [376];
  undefined1 local_1830 [8];
  undefined1 local_1828 [376];
  undefined1 local_16b0 [8];
  undefined1 local_16a8 [376];
  undefined1 local_1530 [8];
  undefined1 local_1528 [376];
  undefined1 local_13b0 [8];
  undefined1 local_13a8 [376];
  undefined1 local_1230 [8];
  undefined1 local_1228 [376];
  undefined1 local_10b0 [8];
  undefined1 local_10a8 [376];
  undefined1 local_f30 [8];
  undefined1 local_f28 [376];
  undefined1 local_db0 [8];
  undefined1 local_da8 [376];
  undefined1 local_c30 [8];
  undefined1 local_c28 [376];
  undefined1 local_ab0 [8];
  undefined1 local_aa8 [376];
  undefined1 local_930 [120];
  ios_base local_8b8 [264];
  undefined1 local_7b0 [120];
  ios_base local_738 [264];
  undefined1 local_630 [120];
  ios_base local_5b8 [264];
  undefined1 local_4b0 [120];
  ios_base local_438 [264];
  undefined1 local_330 [120];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_27e0 = &this->m_programResources;
  std::
  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  ::resize(local_27e0,
           ((long)(this->m_programContexts).
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_programContexts).
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3);
  pPVar12 = (this->m_programContexts).
            super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar19 = (this->m_programContexts).
            super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pPVar19 - (long)pPVar12) >> 3) * 0x3cf3cf3d) {
    lVar24 = 0;
    do {
      lVar21 = *(long *)&pPVar12[lVar24].textureSpecs.
                         super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                         ._M_impl.super__Vector_impl_data;
      if (0 < (int)((ulong)((long)pPVar12[lVar24].textureSpecs.
                                  super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - lVar21) >> 4) *
              -0x33333333) {
        local_27d0 = &pPVar12[lVar24].textureSpecs;
        pPVar3 = (local_27e0->
                 super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar23 = 0;
        local_27d8 = lVar24;
        do {
          lVar25 = lVar23 * 0x50;
          local_2128._0_8_ =
               glu::mapGLTransferFormat
                         (*(deUint32 *)(lVar21 + 0x10 + lVar25),
                          *(deUint32 *)(lVar21 + 0x14 + lVar25));
          local_25a8 = (undefined1  [8])0x0;
          pSStack_25a0 = (SharedPtrStateBase *)0x0;
          pPVar7 = (this->m_programResources).
                   super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(this->m_programResources).
                                  super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) >> 7) <
              1) {
LAB_017fca94:
            pTVar9 = (TextureLevel *)operator_new(0x28);
            tcu::TextureLevel::TextureLevel(pTVar9,(TextureFormat *)local_2128);
            pSVar10 = (SharedPtrStateBase *)operator_new(0x20);
            pSVar10->strongRefCount = 0;
            pSVar10->weakRefCount = 0;
            pSVar10->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0217a718;
            pSVar10[1]._vptr_SharedPtrStateBase = (_func_int **)pTVar9;
            pSVar10->strongRefCount = 1;
            pSVar10->weakRefCount = 1;
            if (pSStack_25a0 != pSVar10) {
              if (pSStack_25a0 != (SharedPtrStateBase *)0x0) {
                LOCK();
                pdVar11 = &pSStack_25a0->strongRefCount;
                *pdVar11 = *pdVar11 + -1;
                UNLOCK();
                if (*pdVar11 == 0) {
                  local_25a8 = (undefined1  [8])0x0;
                  (*pSStack_25a0->_vptr_SharedPtrStateBase[2])();
                }
                LOCK();
                pdVar11 = &pSStack_25a0->weakRefCount;
                *pdVar11 = *pdVar11 + -1;
                UNLOCK();
                if ((*pdVar11 == 0) && (pSStack_25a0 != (SharedPtrStateBase *)0x0)) {
                  (*pSStack_25a0->_vptr_SharedPtrStateBase[1])();
                }
              }
              LOCK();
              pSVar10->strongRefCount = pSVar10->strongRefCount + 1;
              UNLOCK();
              LOCK();
              pSVar10->weakRefCount = pSVar10->weakRefCount + 1;
              UNLOCK();
              local_25a8 = (undefined1  [8])pTVar9;
              pSStack_25a0 = pSVar10;
            }
            pdVar11 = &pSVar10->strongRefCount;
            LOCK();
            *pdVar11 = *pdVar11 + -1;
            UNLOCK();
            if (*pdVar11 == 0) {
              (*pSVar10->_vptr_SharedPtrStateBase[2])(pSVar10);
            }
            pdVar11 = &pSVar10->weakRefCount;
            LOCK();
            *pdVar11 = *pdVar11 + -1;
            UNLOCK();
            if (*pdVar11 == 0) {
              (*pSVar10->_vptr_SharedPtrStateBase[1])(pSVar10);
            }
          }
          else {
            lVar28 = 0;
            do {
              lVar4 = *(long *)&pPVar7[lVar28].dummyTextures.
                                super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                                ._M_impl;
              uVar5 = (uint)((ulong)((long)pPVar7[lVar28].dummyTextures.
                                           super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - lVar4) >> 4)
              ;
              if (0 < (int)uVar5) {
                uVar8 = (ulong)(uVar5 & 0x7fffffff);
                plVar26 = (long *)(lVar4 + 8);
                do {
                  pTVar9 = (TextureLevel *)plVar26[-1];
                  if ((local_2128._0_4_ == (pTVar9->m_format).order) &&
                     (local_2128._4_4_ == (pTVar9->m_format).type)) {
                    pSVar10 = (SharedPtrStateBase *)*plVar26;
                    if (pSStack_25a0 != pSVar10) {
                      if (pSStack_25a0 != (SharedPtrStateBase *)0x0) {
                        LOCK();
                        pdVar11 = &pSStack_25a0->strongRefCount;
                        *pdVar11 = *pdVar11 + -1;
                        UNLOCK();
                        if (*pdVar11 == 0) {
                          local_25a8 = (undefined1  [8])0x0;
                          (*pSStack_25a0->_vptr_SharedPtrStateBase[2])();
                        }
                        LOCK();
                        pdVar11 = &pSStack_25a0->weakRefCount;
                        *pdVar11 = *pdVar11 + -1;
                        UNLOCK();
                        if ((*pdVar11 == 0) && (pSStack_25a0 != (SharedPtrStateBase *)0x0)) {
                          (*pSStack_25a0->_vptr_SharedPtrStateBase[1])();
                        }
                        pTVar9 = (TextureLevel *)plVar26[-1];
                        pSVar10 = (SharedPtrStateBase *)*plVar26;
                      }
                      local_25a8 = (undefined1  [8])pTVar9;
                      pSStack_25a0 = pSVar10;
                      if (pSVar10 != (SharedPtrStateBase *)0x0) {
                        LOCK();
                        pSVar10->strongRefCount = pSVar10->strongRefCount + 1;
                        UNLOCK();
                        LOCK();
                        pSVar10->weakRefCount = pSVar10->weakRefCount + 1;
                        UNLOCK();
                      }
                    }
                    break;
                  }
                  plVar26 = plVar26 + 2;
                  uVar8 = uVar8 - 1;
                } while (uVar8 != 0);
              }
              lVar28 = lVar28 + 1;
              pPVar7 = (this->m_programResources).
                       super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar28 < (int)((ulong)((long)(this->m_programResources).
                                                  super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pPVar7) >> 7));
            if (local_25a8 == (undefined1  [8])0x0) goto LAB_017fca94;
          }
          lVar21 = lVar21 + lVar25;
          if (((IVec3 *)((long)local_25a8 + 8))->m_data[0] < *(int *)(lVar21 + 8)) {
            iVar6 = *(int *)(lVar21 + 0xc);
LAB_017fcbb1:
            tcu::TextureLevel::setSize((TextureLevel *)local_25a8,*(int *)(lVar21 + 8),iVar6,1);
            tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2428,(TextureLevel *)local_25a8)
            ;
            tcu::fillWithComponentGradients
                      ((PixelBufferAccess *)local_2428,(Vec4 *)(lVar21 + 0x30),
                       (Vec4 *)(lVar21 + 0x40));
          }
          else {
            iVar6 = *(int *)(lVar21 + 0xc);
            if (((IVec3 *)((long)local_25a8 + 8))->m_data[1] < iVar6) goto LAB_017fcbb1;
          }
          std::
          vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
          ::push_back(&pPVar3[lVar24].dummyTextures,(value_type *)local_25a8);
          if (pSStack_25a0 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar11 = &pSStack_25a0->strongRefCount;
            *pdVar11 = *pdVar11 + -1;
            UNLOCK();
            if (*pdVar11 == 0) {
              local_25a8 = (undefined1  [8])0x0;
              (*pSStack_25a0->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar11 = &pSStack_25a0->weakRefCount;
            *pdVar11 = *pdVar11 + -1;
            UNLOCK();
            if ((*pdVar11 == 0) && (pSStack_25a0 != (SharedPtrStateBase *)0x0)) {
              (*pSStack_25a0->_vptr_SharedPtrStateBase[1])();
            }
          }
          lVar23 = lVar23 + 1;
          lVar21 = *(long *)&(local_27d0->
                             super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                             )._M_impl.super__Vector_impl_data;
        } while (lVar23 < (int)((ulong)((long)(local_27d0->
                                              super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                              )._M_impl.super__Vector_impl_data._M_finish - lVar21)
                               >> 4) * -0x33333333);
        pPVar12 = (this->m_programContexts).
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar19 = (this->m_programContexts).
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar24 = local_27d8;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < (int)((ulong)((long)pPVar19 - (long)pPVar12) >> 3) * 0x3cf3cf3d);
  }
  first._M_current =
       (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
       _M_impl.super__Vector_impl_data._M_start;
  last._M_current =
       (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (last._M_current != first._M_current) {
    (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = first._M_current;
    last._M_current = first._M_current;
  }
  iVar6 = this->m_numVerticesPerDrawCall;
  if (0 < iVar6) {
    iVar22 = 0;
    do {
      local_2428._0_2_ = (unsigned_short)iVar22;
      __position._M_current =
           (this->m_vertexIndices).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vertexIndices).
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&this->m_vertexIndices,__position,(unsigned_short *)local_2428);
        iVar6 = this->m_numVerticesPerDrawCall;
      }
      else {
        *__position._M_current = (unsigned_short)iVar22;
        (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar22 = iVar22 + 1;
    } while (iVar22 < iVar6);
    first._M_current =
         (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
         ._M_impl.super__Vector_impl_data._M_start;
    last._M_current =
         (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
            (&this->m_rnd,first,last);
  pGVar13 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *)operator_new(0x48);
  p_Var1 = &(pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pGVar13->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar13->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar13->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_programs = pGVar13;
  pGVar14 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *)operator_new(0x48);
  p_Var1 = &(pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pGVar14->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar14->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar14->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_buffers = pGVar14;
  pGVar15 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *)operator_new(0x48);
  p_Var1 = &(pGVar15->m_objects)._M_t._M_impl.super__Rb_tree_header;
  (pGVar15->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar15->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pGVar15->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pGVar15->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pGVar15->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pGVar15->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar15->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar15->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_textures = pGVar15;
  this->m_currentIteration = 0;
  this_01 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_930 + 8);
  local_930._0_8_ = this_01;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Number of iterations: ",0x16);
  if (this->m_numIterations < 1) {
    local_2800 = local_27f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2800,"infinite","");
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1ca8);
    std::ostream::operator<<(&local_1ca8,this->m_numIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1ca8);
    std::ios_base::~ios_base(local_1c38);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,(char *)local_2800,local_27f8);
  local_7b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_930,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar2 = (ostringstream *)(local_7b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Number of draw calls per iteration: ",0x24);
  std::ostream::operator<<(poVar2,this->m_numDrawCallsPerIteration);
  local_630._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_7b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar2 = (ostringstream *)(local_630 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Number of triangles per draw call: ",0x23);
  std::ostream::operator<<(poVar2,this->m_numTrianglesPerDrawCall);
  local_4b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_4b0 + 8),"Using triangle strips",0x15);
  local_330._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar2 = (ostringstream *)(local_330 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Approximate texture memory usage limit: ",0x28);
  de::floatToString_abi_cxx11_
            (&local_25c8,(de *)0x2,(float)this->m_maxTexMemoryUsageBytes * 9.536743e-07,precision);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,local_25c8._M_dataplus._M_p,local_25c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," MiB",4);
  local_1b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Approximate buffer memory usage limit: ",0x27);
  de::floatToString_abi_cxx11_
            (&local_25e8,(de *)0x2,(float)this->m_maxBufMemoryUsageBytes * 9.536743e-07,precision_00
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,local_25e8._M_dataplus._M_p,local_25e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," MiB",4);
  local_19b0 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_19a8,"Default vertex attribute data buffer usage parameter: ",0x36);
  pcVar16 = glu::getUsageName(this->m_attrBufferUsage);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)local_19a8 + (int)*(_func_int **)(local_19a8._0_8_ + -0x18));
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_19a8,pcVar16,sVar17);
  }
  local_1830 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_19b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1828);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1828,"Default vertex index data buffer usage parameter: ",0x32);
  pcVar16 = glu::getUsageName(this->m_indexBufferUsage);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)local_1828 + (int)*(_func_int **)(local_1828._0_8_ + -0x18));
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1828,pcVar16,sVar17);
  }
  pTVar18 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1830,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_2820._M_dataplus._M_p = (pointer)&local_2820.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2820,"ProbabilityParams","");
  local_2840._M_dataplus._M_p = (pointer)&local_2840.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2840,"Per-iteration probability parameters","");
  tcu::LogSection::LogSection(&local_1ca8,&local_2820,&local_2840);
  tcu::TestLog::startSection
            (pTVar18,local_1ca8.m_name._M_dataplus._M_p,local_1ca8.m_description._M_dataplus._M_p);
  local_16b0 = (undefined1  [8])pTVar18;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16a8);
  pcVar16 = "Program re-build: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_16a8,"Program re-build: ",0x12);
  probabilityStr_abi_cxx11_(&local_2608,(gls *)pcVar16,(this->m_probabilities).rebuildProgram);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_16a8,local_2608._M_dataplus._M_p,local_2608._M_string_length);
  local_1530 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_16b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1528);
  pcVar16 = "Texture re-upload: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1528,"Texture re-upload: ",0x13);
  probabilityStr_abi_cxx11_(&local_2628,(gls *)pcVar16,(this->m_probabilities).reuploadTexture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1528,local_2628._M_dataplus._M_p,local_2628._M_string_length);
  local_13b0 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1530,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13a8);
  pcVar16 = "Buffer re-upload: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_13a8,"Buffer re-upload: ",0x12);
  probabilityStr_abi_cxx11_(&local_2648,(gls *)pcVar16,(this->m_probabilities).reuploadBuffer);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_13a8,local_2648._M_dataplus._M_p,local_2648._M_string_length);
  local_1230 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_13b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1228);
  pcVar16 = "Use glTexImage* instead of glTexSubImage* when uploading texture: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1228,
             "Use glTexImage* instead of glTexSubImage* when uploading texture: ",0x42);
  probabilityStr_abi_cxx11_(&local_2668,(gls *)pcVar16,(this->m_probabilities).reuploadWithTexImage)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1228,local_2668._M_dataplus._M_p,local_2668._M_string_length);
  local_10b0 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1230,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10a8);
  pcVar16 = "Use glBufferData* instead of glBufferSubData* when uploading buffer: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_10a8,
             "Use glBufferData* instead of glBufferSubData* when uploading buffer: ",0x45);
  probabilityStr_abi_cxx11_
            (&local_2688,(gls *)pcVar16,(this->m_probabilities).reuploadWithBufferData);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_10a8,local_2688._M_dataplus._M_p,local_2688._M_string_length);
  local_f30 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_10b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f28);
  pcVar16 = "Delete texture after using it, even if could re-use it: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_f28,"Delete texture after using it, even if could re-use it: ",0x38);
  probabilityStr_abi_cxx11_(&local_26a8,(gls *)pcVar16,(this->m_probabilities).deleteTexture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_f28,local_26a8._M_dataplus._M_p,local_26a8._M_string_length);
  local_db0 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_f30,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_da8);
  pcVar16 = "Delete buffer after using it, even if could re-use it: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_da8,"Delete buffer after using it, even if could re-use it: ",0x37);
  probabilityStr_abi_cxx11_(&local_26c8,(gls *)pcVar16,(this->m_probabilities).deleteBuffer);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_da8,local_26c8._M_dataplus._M_p,local_26c8._M_string_length);
  local_c30 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_db0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
  pcVar16 = "Don\'t re-use texture, and only delete if memory limit is hit: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_c28,"Don\'t re-use texture, and only delete if memory limit is hit: ",
             0x3e);
  probabilityStr_abi_cxx11_
            (&local_26e8,(gls *)pcVar16,(this->m_probabilities).wastefulTextureMemoryUsage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_c28,local_26e8._M_dataplus._M_p,local_26e8._M_string_length);
  local_ab0 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_c30,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_aa8);
  pcVar16 = "Don\'t re-use buffer, and only delete if memory limit is hit: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_aa8,"Don\'t re-use buffer, and only delete if memory limit is hit: ",
             0x3d);
  probabilityStr_abi_cxx11_
            (&local_2708,(gls *)pcVar16,(this->m_probabilities).wastefulBufferMemoryUsage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_aa8,local_2708._M_dataplus._M_p,local_2708._M_string_length);
  local_1b30 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_ab0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b28);
  pcVar16 = "Use client memory (instead of GL buffers) for vertex attribute data: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b28,
             "Use client memory (instead of GL buffers) for vertex attribute data: ",0x45);
  probabilityStr_abi_cxx11_
            (&local_2728,(gls *)pcVar16,(this->m_probabilities).clientMemoryAttributeData);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b28,local_2728._M_dataplus._M_p,local_2728._M_string_length);
  local_22a8 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b30,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_22a0);
  pcVar16 = "Use client memory (instead of GL buffers) for vertex index data: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_22a0,
             "Use client memory (instead of GL buffers) for vertex index data: ",0x41);
  probabilityStr_abi_cxx11_
            (&local_2748,(gls *)pcVar16,(this->m_probabilities).clientMemoryIndexData);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_22a0,local_2748._M_dataplus._M_p,local_2748._M_string_length);
  local_1e28 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_22a8,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e20);
  pcVar16 = "Use random target parameter when uploading buffer data: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e20,"Use random target parameter when uploading buffer data: ",0x38);
  probabilityStr_abi_cxx11_
            (&local_2768,(gls *)pcVar16,(this->m_probabilities).randomBufferUploadTarget);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e20,local_2768._M_dataplus._M_p,local_2768._M_string_length);
  local_1fa8 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1e28,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1fa0);
  pcVar16 = "Use random usage parameter when uploading buffer data: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1fa0,"Use random usage parameter when uploading buffer data: ",0x37);
  probabilityStr_abi_cxx11_(&local_2788,(gls *)pcVar16,(this->m_probabilities).randomBufferUsage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1fa0,local_2788._M_dataplus._M_p,local_2788._M_string_length);
  local_2128._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1fa8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar2 = (ostringstream *)(local_2128 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  pcVar16 = "Use glDrawArrays instead of glDrawElements: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Use glDrawArrays instead of glDrawElements: ",0x2c);
  probabilityStr_abi_cxx11_(&local_27a8,(gls *)pcVar16,(this->m_probabilities).useDrawArrays);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,local_27a8._M_dataplus._M_p,local_27a8._M_string_length);
  local_25a8 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_2128,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_25a0);
  pcVar16 = "Use separate buffers for each attribute, instead of one array for all: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_25a0,
             "Use separate buffers for each attribute, instead of one array for all: ",0x47);
  probabilityStr_abi_cxx11_
            (&local_27c8,(gls *)pcVar16,(this->m_probabilities).separateAttributeBuffers);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_25a0,local_27c8._M_dataplus._M_p,local_27c8._M_string_length);
  this_02 = (TextureFormat)
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_25a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::endSection((TestLog *)this_02);
  this_00 = (ostringstream *)(local_2428 + 8);
  local_2428._0_8_ = this_02;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Using ",6);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," program(s)",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_23b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27c8._M_dataplus._M_p != &local_27c8.field_2) {
    operator_delete(local_27c8._M_dataplus._M_p,local_27c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_25a0);
  std::ios_base::~ios_base(local_2530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27a8._M_dataplus._M_p != &local_27a8.field_2) {
    operator_delete(local_27a8._M_dataplus._M_p,local_27a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_20b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2788._M_dataplus._M_p != &local_2788.field_2) {
    operator_delete(local_2788._M_dataplus._M_p,local_2788.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1fa0);
  std::ios_base::~ios_base(local_1f30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2768._M_dataplus._M_p != &local_2768.field_2) {
    operator_delete(local_2768._M_dataplus._M_p,local_2768.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e20);
  std::ios_base::~ios_base(local_1db0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2748._M_dataplus._M_p != &local_2748.field_2) {
    operator_delete(local_2748._M_dataplus._M_p,local_2748.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_22a0);
  std::ios_base::~ios_base(local_2230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2728._M_dataplus._M_p != &local_2728.field_2) {
    operator_delete(local_2728._M_dataplus._M_p,local_2728.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b28);
  std::ios_base::~ios_base(local_1ab8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2708._M_dataplus._M_p != &local_2708.field_2) {
    operator_delete(local_2708._M_dataplus._M_p,local_2708.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_aa8);
  std::ios_base::~ios_base((ios_base *)(local_aa8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26e8._M_dataplus._M_p != &local_26e8.field_2) {
    operator_delete(local_26e8._M_dataplus._M_p,local_26e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
  std::ios_base::~ios_base((ios_base *)(local_c28 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26c8._M_dataplus._M_p != &local_26c8.field_2) {
    operator_delete(local_26c8._M_dataplus._M_p,local_26c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_da8);
  std::ios_base::~ios_base((ios_base *)(local_da8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26a8._M_dataplus._M_p != &local_26a8.field_2) {
    operator_delete(local_26a8._M_dataplus._M_p,local_26a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f28);
  std::ios_base::~ios_base((ios_base *)(local_f28 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2688._M_dataplus._M_p != &local_2688.field_2) {
    operator_delete(local_2688._M_dataplus._M_p,local_2688.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10a8);
  std::ios_base::~ios_base((ios_base *)(local_10a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2668._M_dataplus._M_p != &local_2668.field_2) {
    operator_delete(local_2668._M_dataplus._M_p,local_2668.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1228);
  std::ios_base::~ios_base((ios_base *)(local_1228 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2648._M_dataplus._M_p != &local_2648.field_2) {
    operator_delete(local_2648._M_dataplus._M_p,local_2648.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13a8);
  std::ios_base::~ios_base((ios_base *)(local_13a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2628._M_dataplus._M_p != &local_2628.field_2) {
    operator_delete(local_2628._M_dataplus._M_p,local_2628.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1528);
  std::ios_base::~ios_base((ios_base *)(local_1528 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2608._M_dataplus._M_p != &local_2608.field_2) {
    operator_delete(local_2608._M_dataplus._M_p,local_2608.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16a8);
  std::ios_base::~ios_base((ios_base *)(local_16a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ca8.m_description._M_dataplus._M_p != &local_1ca8.m_description.field_2) {
    operator_delete(local_1ca8.m_description._M_dataplus._M_p,
                    local_1ca8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ca8.m_name._M_dataplus._M_p != &local_1ca8.m_name.field_2) {
    operator_delete(local_1ca8.m_name._M_dataplus._M_p,
                    local_1ca8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2840._M_dataplus._M_p != &local_2840.field_2) {
    operator_delete(local_2840._M_dataplus._M_p,local_2840.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2820._M_dataplus._M_p != &local_2820.field_2) {
    operator_delete(local_2820._M_dataplus._M_p,local_2820.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1828);
  std::ios_base::~ios_base((ios_base *)(local_1828 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19a8);
  std::ios_base::~ios_base((ios_base *)(local_19a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25e8._M_dataplus._M_p != &local_25e8.field_2) {
    operator_delete(local_25e8._M_dataplus._M_p,local_25e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25c8._M_dataplus._M_p != &local_25c8.field_2) {
    operator_delete(local_25c8._M_dataplus._M_p,local_25c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_330 + 8));
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4b0 + 8));
  std::ios_base::~ios_base(local_438);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_630 + 8));
  std::ios_base::~ios_base(local_5b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_7b0 + 8));
  std::ios_base::~ios_base(local_738);
  if (local_2800 != local_27f0) {
    operator_delete(local_2800,local_27f0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_930 + 8));
  std::ios_base::~ios_base(local_8b8);
  pPVar12 = (this->m_programContexts).
            super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)(this->m_programContexts).
                              super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar12) >> 3) *
          0x3cf3cf3d;
  if (0 < iVar6) {
    lVar24 = 0;
    bVar27 = 0;
    do {
      local_1fa8 = (undefined1  [8])local_1f98;
      renderCtx = this->m_renderCtx;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1fa8,0x1aee929);
      mangleShaderNames((string *)local_2128,&pPVar12[lVar24].vertexSource,(string *)local_1fa8);
      local_22a8 = (undefined1  [8])(local_22a0 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_22a8,0x1aee929);
      mangleShaderNames((string *)local_1e28,&pPVar12[lVar24].fragmentSource,(string *)local_22a8);
      memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2428,0,0xac);
      local_2378._0_8_ = (pointer)0x0;
      local_2378[8] = 0;
      local_2378._9_7_ = 0;
      local_2378[0x10] = 0;
      local_2378._17_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2428,(value_type *)local_2128);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_2410,(value_type *)local_1e28);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_25a8,renderCtx,(ProgramSources *)local_2428);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2378);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_2398);
      lVar21 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2428 + lVar21));
        lVar21 = lVar21 + -0x18;
      } while (lVar21 != -0x18);
      if (local_1e28 != (undefined1  [8])(local_1e20 + 8)) {
        operator_delete((void *)local_1e28,local_1e18[0]._M_allocated_capacity + 1);
      }
      if (local_22a8 != (undefined1  [8])(local_22a0 + 8)) {
        operator_delete((void *)local_22a8,(ulong)(local_2298[0]._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2128._0_8_ != &local_2118) {
        operator_delete((void *)local_2128._0_8_,local_2118._M_allocated_capacity + 1);
      }
      if (local_1fa8 != (undefined1  [8])local_1f98) {
        operator_delete((void *)local_1fa8,(ulong)(local_1f98[0]._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2428);
      std::ostream::operator<<((ostringstream *)local_2428,(int)lVar24);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2428);
      std::ios_base::~ios_base(local_23b8);
      plVar26 = (long *)std::__cxx11::string::replace((ulong)local_1e28,0,(char *)0x0,0x1cc1ff9);
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar26 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar26 == paVar20) {
        local_1f98[0]._0_8_ = paVar20->_M_allocated_capacity;
        local_1f98[0]._8_8_ = plVar26[3];
        local_1fa8 = (undefined1  [8])local_1f98;
      }
      else {
        local_1f98[0]._0_8_ = paVar20->_M_allocated_capacity;
        local_1fa8 = (undefined1  [8])*plVar26;
      }
      local_1fa0 = (_func_int **)plVar26[1];
      *plVar26 = (long)paVar20;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2428);
      std::ostream::operator<<((ostringstream *)local_2428,(int)lVar24);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2428);
      std::ios_base::~ios_base(local_23b8);
      plVar26 = (long *)std::__cxx11::string::replace((ulong)local_1b30,0,(char *)0x0,0x1ca7ccd);
      pTVar18 = (TestLog *)(plVar26 + 2);
      if ((TestLog *)*plVar26 == pTVar18) {
        local_2298[0]._0_8_ = pTVar18->m_log;
        local_2298[0]._8_8_ = plVar26[3];
        local_22a8 = (undefined1  [8])(local_22a0 + 8);
      }
      else {
        local_2298[0]._0_8_ = pTVar18->m_log;
        local_22a8 = (undefined1  [8])*plVar26;
      }
      local_22a0 = (undefined1  [8])plVar26[1];
      *plVar26 = (long)pTVar18;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      tcu::LogSection::LogSection
                ((LogSection *)local_2128,(string *)local_1fa8,(string *)local_22a8);
      tcu::TestLog::startSection(this_01,(char *)local_2128._0_8_,local_2108._M_p);
      pTVar18 = glu::operator<<(this_01,(ShaderProgram *)local_25a8);
      tcu::TestLog::endSection(pTVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2108._M_p != local_20f8) {
        operator_delete(local_2108._M_p,local_20f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2128._0_8_ != &local_2118) {
        operator_delete((void *)local_2128._0_8_,local_2118._M_allocated_capacity + 1);
      }
      if (local_22a8 != (undefined1  [8])(local_22a0 + 8)) {
        operator_delete((void *)local_22a8,(ulong)(local_2298[0]._M_allocated_capacity + 1));
      }
      if (local_1b30 != (undefined1  [8])local_1b20) {
        operator_delete((void *)local_1b30,(ulong)((long)&(local_1b20[0].m_log)->flags + 1));
      }
      if (local_1fa8 != (undefined1  [8])local_1f98) {
        operator_delete((void *)local_1fa8,(ulong)(local_1f98[0]._M_allocated_capacity + 1));
      }
      if (local_1e28 != (undefined1  [8])(local_1e20 + 8)) {
        operator_delete((void *)local_1e28,local_1e18[0]._M_allocated_capacity + 1);
      }
      bVar27 = bVar27 | local_24e8 ^ 1U;
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_25a8);
      lVar24 = lVar24 + 1;
      pPVar12 = (this->m_programContexts).
                super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = (int)((ulong)((long)(this->m_programContexts).
                                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar12) >> 3)
              * 0x3cf3cf3d;
    } while (lVar24 < iVar6);
    if ((bVar27 & 1) != 0) {
      this_04 = (TestError *)__cxa_allocate_exception(0x38);
      local_2428._0_8_ = local_2418;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2428,"One or more shader programs failed to compile","");
      tcu::TestError::TestError(this_04,(string *)local_2428);
      __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_showDebugInfo == true) {
    this_03 = (DebugInfoRenderer *)operator_new(0x40);
    LongStressCaseInternal::DebugInfoRenderer::DebugInfoRenderer(this_03,this->m_renderCtx);
    this->m_debugInfoRenderer = this_03;
    iVar6 = extraout_EAX;
  }
  return iVar6;
}

Assistant:

void LongStressCase::init (void)
{
	// Generate dummy texture data for each texture spec in m_programContexts.

	DE_ASSERT(!m_programContexts.empty());
	DE_ASSERT(m_programResources.empty());
	m_programResources.resize(m_programContexts.size());

	for (int progCtxNdx = 0; progCtxNdx < (int)m_programContexts.size(); progCtxNdx++)
	{
		const ProgramContext&	progCtx = m_programContexts[progCtxNdx];
		ProgramResources&		progRes = m_programResources[progCtxNdx];

		for (int texSpecNdx = 0; texSpecNdx < (int)progCtx.textureSpecs.size(); texSpecNdx++)
		{
			const TextureSpec&		spec	= progCtx.textureSpecs[texSpecNdx];
			const TextureFormat		format	= glu::mapGLTransferFormat(spec.format, spec.dataType);

			// If texture data with the same format has already been generated, re-use that (don't care much about contents).

			SharedPtr<TextureLevel> dummyTex;

			for (int prevProgCtxNdx = 0; prevProgCtxNdx < (int)m_programResources.size(); prevProgCtxNdx++)
			{
				const vector<SharedPtr<TextureLevel> >& prevProgCtxTextures = m_programResources[prevProgCtxNdx].dummyTextures;

				for (int texNdx = 0; texNdx < (int)prevProgCtxTextures.size(); texNdx++)
				{
					if (prevProgCtxTextures[texNdx]->getFormat() == format)
					{
						dummyTex = prevProgCtxTextures[texNdx];
						break;
					}
				}
			}

			if (!dummyTex)
				dummyTex = SharedPtr<TextureLevel>(new TextureLevel(format));

			if (dummyTex->getWidth() < spec.width || dummyTex->getHeight() < spec.height)
			{
				dummyTex->setSize(spec.width, spec.height);
				tcu::fillWithComponentGradients(dummyTex->getAccess(), spec.minValue, spec.maxValue);
			}

			progRes.dummyTextures.push_back(dummyTex);
		}
	}

	m_vertexIndices.clear();
	for (int i = 0; i < m_numVerticesPerDrawCall; i++)
		m_vertexIndices.push_back((deUint16)i);
	m_rnd.shuffle(m_vertexIndices.begin(), m_vertexIndices.end());

	DE_ASSERT(!m_programs && !m_buffers && !m_textures);
	m_programs = new GLObjectManager<Program>;
	m_buffers = new GLObjectManager<Buffer>;
	m_textures = new GLObjectManager<Texture>;

	m_currentIteration = 0;

	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "Number of iterations: "										<< (m_numIterations > 0 ? toString(m_numIterations) : "infinite")				<< TestLog::EndMessage
			<< TestLog::Message << "Number of draw calls per iteration: "						<< m_numDrawCallsPerIteration													<< TestLog::EndMessage
			<< TestLog::Message << "Number of triangles per draw call: "						<< m_numTrianglesPerDrawCall													<< TestLog::EndMessage
			<< TestLog::Message << "Using triangle strips"																														<< TestLog::EndMessage
			<< TestLog::Message << "Approximate texture memory usage limit: "					<< de::floatToString((float)m_maxTexMemoryUsageBytes / Mi, 2) << " MiB"			<< TestLog::EndMessage
			<< TestLog::Message << "Approximate buffer memory usage limit: "					<< de::floatToString((float)m_maxBufMemoryUsageBytes / Mi, 2) << " MiB"			<< TestLog::EndMessage
			<< TestLog::Message << "Default vertex attribute data buffer usage parameter: "		<< glu::getUsageName(m_attrBufferUsage)											<< TestLog::EndMessage
			<< TestLog::Message << "Default vertex index data buffer usage parameter: "			<< glu::getUsageName(m_indexBufferUsage)										<< TestLog::EndMessage

			<< TestLog::Section("ProbabilityParams", "Per-iteration probability parameters")
			<< TestLog::Message << "Program re-build: "															<< probabilityStr(m_probabilities.rebuildProgram)				<< TestLog::EndMessage
			<< TestLog::Message << "Texture re-upload: "														<< probabilityStr(m_probabilities.reuploadTexture)				<< TestLog::EndMessage
			<< TestLog::Message << "Buffer re-upload: "															<< probabilityStr(m_probabilities.reuploadBuffer)				<< TestLog::EndMessage
			<< TestLog::Message << "Use glTexImage* instead of glTexSubImage* when uploading texture: "			<< probabilityStr(m_probabilities.reuploadWithTexImage)			<< TestLog::EndMessage
			<< TestLog::Message << "Use glBufferData* instead of glBufferSubData* when uploading buffer: "		<< probabilityStr(m_probabilities.reuploadWithBufferData)		<< TestLog::EndMessage
			<< TestLog::Message << "Delete texture after using it, even if could re-use it: "					<< probabilityStr(m_probabilities.deleteTexture)				<< TestLog::EndMessage
			<< TestLog::Message << "Delete buffer after using it, even if could re-use it: "					<< probabilityStr(m_probabilities.deleteBuffer)					<< TestLog::EndMessage
			<< TestLog::Message << "Don't re-use texture, and only delete if memory limit is hit: "				<< probabilityStr(m_probabilities.wastefulTextureMemoryUsage)	<< TestLog::EndMessage
			<< TestLog::Message << "Don't re-use buffer, and only delete if memory limit is hit: "				<< probabilityStr(m_probabilities.wastefulBufferMemoryUsage)	<< TestLog::EndMessage
			<< TestLog::Message << "Use client memory (instead of GL buffers) for vertex attribute data: "		<< probabilityStr(m_probabilities.clientMemoryAttributeData)	<< TestLog::EndMessage
			<< TestLog::Message << "Use client memory (instead of GL buffers) for vertex index data: "			<< probabilityStr(m_probabilities.clientMemoryIndexData)		<< TestLog::EndMessage
			<< TestLog::Message << "Use random target parameter when uploading buffer data: "					<< probabilityStr(m_probabilities.randomBufferUploadTarget)		<< TestLog::EndMessage
			<< TestLog::Message << "Use random usage parameter when uploading buffer data: "					<< probabilityStr(m_probabilities.randomBufferUsage)			<< TestLog::EndMessage
			<< TestLog::Message << "Use glDrawArrays instead of glDrawElements: "								<< probabilityStr(m_probabilities.useDrawArrays)				<< TestLog::EndMessage
			<< TestLog::Message << "Use separate buffers for each attribute, instead of one array for all: "	<< probabilityStr(m_probabilities.separateAttributeBuffers)		<< TestLog::EndMessage
			<< TestLog::EndSection
			<< TestLog::Message << "Using " << m_programContexts.size() << " program(s)" << TestLog::EndMessage;

		bool anyProgramsFailed = false;
		for (int progCtxNdx = 0; progCtxNdx < (int)m_programContexts.size(); progCtxNdx++)
		{
			const ProgramContext& progCtx = m_programContexts[progCtxNdx];
			glu::ShaderProgram prog(m_renderCtx, glu::makeVtxFragSources(mangleShaderNames(progCtx.vertexSource, ""), mangleShaderNames(progCtx.fragmentSource, "")));
			log << TestLog::Section("ShaderProgram" + toString(progCtxNdx), "Shader program " + toString(progCtxNdx)) << prog << TestLog::EndSection;
			if (!prog.isOk())
				anyProgramsFailed = true;
		}

		if (anyProgramsFailed)
			throw tcu::TestError("One or more shader programs failed to compile");
	}

	DE_ASSERT(!m_debugInfoRenderer);
	if (m_showDebugInfo)
		m_debugInfoRenderer = new DebugInfoRenderer(m_renderCtx);
}